

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

longlong SoapySDRDevice_getHardwareTime(SoapySDRDevice *device,char *what)

{
  undefined1 *puVar1;
  longlong lVar2;
  allocator local_31;
  string local_30 [32];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_30,what,&local_31);
  lVar2 = (**(code **)(*(long *)device + 0x270))(device,local_30);
  std::__cxx11::string::~string(local_30);
  return lVar2;
}

Assistant:

long long SoapySDRDevice_getHardwareTime(const SoapySDRDevice *device, const char *what)
{
    __SOAPY_SDR_C_TRY
    return device->getHardwareTime(what);
    __SOAPY_SDR_C_CATCH
}